

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O3

void __thiscall Clasp::SharedContext::setConcurrency(SharedContext *this,uint32 n,ResizeMode mode)

{
  Solver *this_00;
  Share SVar1;
  uint uVar2;
  uint uVar3;
  Share SVar4;
  
  if (n < 2) {
    SVar1 = (Share)(((uint)this->share_ & 0xfffffc00) + 1);
    this->share_ = SVar1;
  }
  else {
    this->share_ = (Share)((uint)this->share_ & 0xfffffc00 | n & 0x3ff);
    bk_lib::pod_vector<Clasp::Solver_*,_std::allocator<Clasp::Solver_*>_>::reserve
              (&this->solvers_,n);
    SVar1 = this->share_;
  }
  uVar3 = (uint)SVar1 & 0x3ff;
  uVar2 = (this->solvers_).ebo_.size;
  if ((mode & resize_push) != resize_reserve) {
    while (uVar2 < uVar3) {
      pushSolver(this);
      SVar1 = this->share_;
      uVar3 = (uint)SVar1 & 0x3ff;
      uVar2 = (this->solvers_).ebo_.size;
    }
  }
  if ((mode & resize_pop) != resize_reserve) {
    while (uVar3 < uVar2) {
      this_00 = (this->solvers_).ebo_.buf[uVar2 - 1];
      if (this_00 != (Solver *)0x0) {
        Solver::~Solver(this_00);
      }
      operator_delete(this_00);
      SVar1 = this->share_;
      uVar2 = (this->solvers_).ebo_.size - 1;
      (this->solvers_).ebo_.size = uVar2;
      uVar3 = (uint)SVar1 & 0x3ff;
    }
  }
  if (((uint)SVar1 >> 0x16 & 1) != 0) {
    SVar4 = (Share)((uint)SVar1 | 0x700000);
    if (((uint)SVar1 & 0x3fe) == 0) {
      SVar4 = (Share)((uint)SVar1 & 0xffcfffff);
    }
    this->share_ = SVar4;
  }
  return;
}

Assistant:

void SharedContext::setConcurrency(uint32 n, ResizeMode mode) {
	if (n <= 1) { share_.count = 1; }
	else        { share_.count = n; solvers_.reserve(n); }
	while (solvers_.size() < share_.count && (mode & resize_push) != 0u) {
		pushSolver();
	}
	while (solvers_.size() > share_.count && (mode & resize_pop) != 0u) {
		delete solvers_.back();
		solvers_.pop_back();
	}
	if ((share_.shareM & ContextParams::share_auto) != 0) {
		setShareMode(ContextParams::share_auto);
	}
}